

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ConstraintItemSyntax * __thiscall
slang::parsing::Parser::parseConstraintItem(Parser *this,bool allowBlock,bool isTopLevel)

{
  Token closeParen;
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  ExpressionSyntax *pEVar4;
  ExpressionConstraintSyntax *pEVar5;
  ForeachLoopListSyntax *loopList;
  LoopConstraintSyntax *pLVar6;
  SourceLocation SVar7;
  undefined8 uVar8;
  ElseConstraintClauseSyntax *elseClause;
  ConditionalConstraintSyntax *pCVar9;
  RangeListSyntax *ranges;
  UniquenessConstraintSyntax *pUVar10;
  DisableConstraintSyntax *pDVar11;
  ConstraintItemSyntax *pCVar12;
  ImplicationConstraintSyntax *pIVar13;
  ConstraintBlockSyntax *pCVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SolveBeforeConstraintSyntax *pSVar15;
  Info *pIVar16;
  Info *extraout_RDX;
  EVP_PKEY_CTX *src;
  TokenKind TVar17;
  ulong uVar18;
  Token TVar19;
  Token TVar20;
  SourceRange range;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> current;
  Token TVar21;
  Token elseKeyword;
  Token openParen;
  Token semi;
  Token solve;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> afterBuffer;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> beforeBuffer;
  Token local_218;
  Token local_208;
  Token local_1f8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1e8;
  ulong local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c0;
  undefined8 local_1b0;
  Info *local_1a8;
  ConstraintItemSyntax *local_1a0;
  Info *local_198;
  undefined8 local_190;
  undefined8 local_188;
  Info *pIStack_180;
  Token local_178;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_168;
  ulong local_158;
  undefined1 local_150 [96];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_f0 [2];
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_78;
  Token local_40;
  
  TVar19 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar19.kind;
  if (TVar2 < IfKeyword) {
    if (TVar2 == OpenBrace) {
      if (allowBlock) {
        local_f0[0].data_ = (pointer)CONCAT44(local_f0[0].data_._4_4_,1);
        TVar19 = ParserBase::peek(&this->super_ParserBase,1);
        if ((TVar19.kind == CloseBrace) ||
           (bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInConcatenationExpr>
                              (this,(uint32_t *)local_f0,OpenBrace,CloseBrace), !bVar1)) {
          pCVar14 = parseConstraintBlock(this,false);
          return &pCVar14->super_ConstraintItemSyntax;
        }
      }
    }
    else {
      if (TVar2 == DisableKeyword) {
        TVar19 = ParserBase::consume(&this->super_ParserBase);
        TVar20 = ParserBase::expect(&this->super_ParserBase,SoftKeyword);
        pEVar4 = parseExpression(this);
        local_178 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        pDVar11 = slang::syntax::SyntaxFactory::disableConstraint
                            (&this->factory,TVar19,TVar20,pEVar4,local_178);
        return &pDVar11->super_ConstraintItemSyntax;
      }
      if (TVar2 == ForeachKeyword) {
        TVar19 = ParserBase::consume(&this->super_ParserBase);
        loopList = parseForeachLoopVariables(this);
        pCVar12 = parseConstraintItem(this,true,false);
        pLVar6 = slang::syntax::SyntaxFactory::loopConstraint
                           (&this->factory,TVar19,loopList,pCVar12);
        return &pLVar6->super_ConstraintItemSyntax;
      }
    }
LAB_003b5dbd:
    TVar19 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpression(TVar19.kind);
    if (bVar1 || allowBlock) {
      TVar19 = ParserBase::peek(&this->super_ParserBase);
      pEVar4 = parseSubExpression(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x84,0);
      if ((allowBlock) ||
         (TVar20 = ParserBase::peek(&this->super_ParserBase),
         TVar19.kind != TVar20.kind || TVar19.info != TVar20.info)) {
        bVar1 = ParserBase::peek(&this->super_ParserBase,MinusArrow);
        if (bVar1) {
          TVar19 = ParserBase::consume(&this->super_ParserBase);
          pCVar12 = parseConstraintItem(this,true,false);
          pIVar13 = slang::syntax::SyntaxFactory::implicationConstraint
                              (&this->factory,pEVar4,TVar19,pCVar12);
          return &pIVar13->super_ConstraintItemSyntax;
        }
        Token::Token(&local_40);
        TVar19 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        pEVar5 = slang::syntax::SyntaxFactory::expressionConstraint
                           (&this->factory,local_40,pEVar4,TVar19);
        return &pEVar5->super_ConstraintItemSyntax;
      }
    }
    return (ConstraintItemSyntax *)0x0;
  }
  if (TVar2 < SolveKeyword) {
    if (TVar2 == IfKeyword) {
      TVar19 = ParserBase::consume(&this->super_ParserBase);
      TVar20 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      pIVar16 = TVar20.info;
      uVar8 = TVar20._0_8_;
      pEVar4 = parseExpression(this);
      TVar20 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      local_198 = TVar20.info;
      local_190 = TVar20._0_8_;
      elseClause = (ElseConstraintClauseSyntax *)0x0;
      local_1a0 = parseConstraintItem(this,true,false);
      bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
      if (bVar1) {
        TVar20 = ParserBase::consume(&this->super_ParserBase);
        elseKeyword.info = TVar20.info;
        local_1b0 = TVar20._0_8_;
        local_1a8 = pIVar16;
        pCVar12 = parseConstraintItem(this,true,false);
        pIVar16 = local_1a8;
        elseKeyword.kind = (undefined2)local_1b0;
        elseKeyword._2_1_ = local_1b0._2_1_;
        elseKeyword.numFlags.raw = local_1b0._3_1_;
        elseKeyword.rawLen = local_1b0._4_4_;
        elseClause = slang::syntax::SyntaxFactory::elseConstraintClause
                               (&this->factory,elseKeyword,pCVar12);
      }
      local_188 = local_190;
      pIStack_180 = local_198;
      closeParen.info = local_198;
      closeParen.kind = (undefined2)local_190;
      closeParen._2_1_ = local_190._2_1_;
      closeParen.numFlags.raw = local_190._3_1_;
      closeParen.rawLen = local_190._4_4_;
      openParen.info = pIVar16;
      openParen.kind = (short)uVar8;
      openParen._2_1_ = (char)((ulong)uVar8 >> 0x10);
      openParen.numFlags.raw = (char)((ulong)uVar8 >> 0x18);
      openParen.rawLen = (int)((ulong)uVar8 >> 0x20);
      pCVar9 = slang::syntax::SyntaxFactory::conditionalConstraint
                         (&this->factory,TVar19,openParen,pEVar4,closeParen,local_1a0,elseClause);
      return &pCVar9->super_ConstraintItemSyntax;
    }
    if (TVar2 == SoftKeyword) {
      TVar19 = ParserBase::consume(&this->super_ParserBase);
      pEVar4 = parseExpressionOrDist(this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      TVar20 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      pEVar5 = slang::syntax::SyntaxFactory::expressionConstraint
                         (&this->factory,TVar19,pEVar4,TVar20);
      return &pEVar5->super_ConstraintItemSyntax;
    }
    goto LAB_003b5dbd;
  }
  if (TVar2 == UniqueKeyword) {
    TVar19 = ParserBase::consume(&this->super_ParserBase);
    ranges = parseRangeList(this);
    TVar20 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pUVar10 = slang::syntax::SyntaxFactory::uniquenessConstraint
                        (&this->factory,TVar19,ranges,TVar20);
    return &pUVar10->super_ConstraintItemSyntax;
  }
  if (TVar2 != SolveKeyword) goto LAB_003b5dbd;
  local_1f8 = ParserBase::consume(&this->super_ParserBase);
  if (!isTopLevel) {
    range = Token::range(&local_1f8);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xa20005,range);
  }
  Token::Token(&local_218);
  local_f0[0].data_ = (pointer)local_f0[0].firstElement;
  local_f0[0].len = 0;
  local_f0[0].cap = 4;
  current._M_first._M_storage =
       (_Uninitialized<slang::parsing::Token,_true>)ParserBase::peek(&this->super_ParserBase);
  local_1e8._M_first._M_storage = current._M_first._M_storage;
  bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(current._0_2_);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar7 = Token::location(&local_1e8._M_first._M_storage);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar7);
    }
    local_218 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(current._0_2_);
    if (bVar1) {
      local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseExpression(this);
      local_158 = CONCAT71(local_158._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_f0,(TokenOrSyntax *)&local_168._M_first);
      TVar19 = ParserBase::peek(&this->super_ParserBase);
      uVar8 = TVar19._0_8_;
      bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar19.kind);
      if (TVar19.kind != EndOfFile && !bVar1) {
        do {
          if ((short)uVar8 != 0x18) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isBeforeOrSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_218 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
                goto LAB_003b629a;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_168._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_158 = local_158 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_f0,(TokenOrSyntax *)&local_168._M_first);
          TVar19 = ParserBase::peek(&this->super_ParserBase);
          TVar17 = TVar19.kind;
          bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar17);
          if (TVar17 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          if ((current._8_8_ == TVar19.info && current._0_2_ == TVar17) &&
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isBeforeOrSemicolon>
                                (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
          pEVar4 = parseExpression(this);
          local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
          local_158 = CONCAT71(local_158._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_f0,(TokenOrSyntax *)&local_168._M_first);
          TVar20 = ParserBase::peek(&this->super_ParserBase);
          uVar8 = TVar20._0_8_;
          bVar1 = slang::syntax::SyntaxFacts::isBeforeOrSemicolon(TVar20.kind);
          current._M_first._M_storage.info = TVar19.info;
          current._M_rest =
               (_Variadic_union<const_slang::syntax::SyntaxNode_*>)(TVar19._0_8_ & 0xffffffff);
        } while (TVar20.kind != EndOfFile && !bVar1);
      }
      local_218 = ParserBase::expect(&this->super_ParserBase,BeforeKeyword);
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,(Token)current._M_first._M_storage,BeforeKeyword,&local_218
                 ,(DiagCode)0x10001);
    }
  }
LAB_003b629a:
  Token::Token(&local_208);
  local_168._M_first._M_storage.info = (Info *)0x0;
  local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_150;
  local_158 = 4;
  TVar19 = ParserBase::peek(&this->super_ParserBase);
  local_78.super_SyntaxListBase._0_16_ = TVar19;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar19.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar7 = Token::location((Token *)&local_78);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar7);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar19.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar19,Semicolon,&local_208,(DiagCode)0x10001);
      pIVar16 = extraout_RDX;
      goto LAB_003b6482;
    }
    pEVar4 = parseExpression(this);
    local_1e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
    local_1d8 = CONCAT71(local_1d8._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_168._M_first,
               (TokenOrSyntax *)&local_1e8._M_first);
    TVar20 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar20.kind);
    if (TVar20.kind == Comma && !bVar1) {
      do {
        local_1e8._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_1d8 = local_1d8 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_168._M_first,
                   (TokenOrSyntax *)&local_1e8._M_first);
        TVar20 = ParserBase::peek(&this->super_ParserBase);
        TVar17 = TVar20.kind;
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar17);
        if (TVar17 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          break;
        }
        if ((TVar19.info == TVar20.info && TVar19.kind == TVar17) &&
           (bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                              (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
        pEVar4 = parseExpression(this);
        local_1e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar4;
        local_1d8 = CONCAT71(local_1d8._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_168._M_first,
                   (TokenOrSyntax *)&local_1e8._M_first);
        TVar21 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar21.kind);
        uVar18 = TVar20._0_8_ & 0xffffffff;
        TVar19.info = TVar20.info;
        TVar19.kind = (short)uVar18;
        TVar19._2_1_ = (char)(uVar18 >> 0x10);
        TVar19.numFlags.raw = (char)(uVar18 >> 0x18);
        TVar19.rawLen = (int)(uVar18 >> 0x20);
      } while (TVar21.kind == Comma && !bVar1);
    }
  }
  local_208 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar16 = local_208.info;
LAB_003b6482:
  TVar20 = local_1f8;
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_f0,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar16
                    );
  TVar19 = local_218;
  local_1c0 = CONCAT44(extraout_var,iVar3);
  local_1e8._8_4_ = 3;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1e8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005cb7c0;
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_168._M_first,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  local_78.elements._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar3);
  local_78.super_SyntaxListBase.super_SyntaxNode.kind = 3;
  local_78.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_78.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005cb7c0;
  pSVar15 = slang::syntax::SyntaxFactory::solveBeforeConstraint
                      (&this->factory,TVar20,
                       (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_1e8._M_first,
                       TVar19,&local_78,local_208);
  if (local_168._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_150) {
    operator_delete((void *)local_168._M_rest);
  }
  if (local_f0[0].data_ == (pointer)local_f0[0].firstElement) {
    return &pSVar15->super_ConstraintItemSyntax;
  }
  operator_delete(local_f0[0].data_);
  return &pSVar15->super_ConstraintItemSyntax;
}

Assistant:

ConstraintItemSyntax* Parser::parseConstraintItem(bool allowBlock, bool isTopLevel) {
    switch (peek().kind) {
        case TokenKind::SolveKeyword: {
            auto solve = consume();
            if (!isTopLevel)
                addDiag(diag::SolveBeforeDisallowed, solve.range());

            Token before;
            SmallVector<TokenOrSyntax, 4> beforeBuffer;
            parseList<isPossibleExpressionOrComma, isBeforeOrSemicolon>(
                beforeBuffer, TokenKind::BeforeKeyword, TokenKind::Comma, before,
                RequireItems::True, diag::ExpectedExpression,
                [this] { return &parseExpression(); });

            Token semi;
            SmallVector<TokenOrSyntax, 4> afterBuffer;
            parseList<isPossibleExpressionOrComma, isSemicolon>(
                afterBuffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
                diag::ExpectedExpression, [this] { return &parseExpression(); });

            return &factory.solveBeforeConstraint(solve, beforeBuffer.copy(alloc), before,
                                                  afterBuffer.copy(alloc), semi);
        }
        case TokenKind::DisableKeyword: {
            auto disable = consume();
            auto soft = expect(TokenKind::SoftKeyword);
            auto& name = parseExpression();
            return &factory.disableConstraint(disable, soft, name, expect(TokenKind::Semicolon));
        }
        case TokenKind::ForeachKeyword: {
            auto keyword = consume();
            auto& vars = parseForeachLoopVariables();
            return &factory.loopConstraint(keyword, vars, *parseConstraintItem(true, false));
        }
        case TokenKind::IfKeyword: {
            auto ifKeyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& condition = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& constraints = *parseConstraintItem(true, false);

            ElseConstraintClauseSyntax* elseClause = nullptr;
            if (peek(TokenKind::ElseKeyword)) {
                auto elseKeyword = consume();
                elseClause = &factory.elseConstraintClause(elseKeyword,
                                                           *parseConstraintItem(true, false));
            }
            return &factory.conditionalConstraint(ifKeyword, openParen, condition, closeParen,
                                                  constraints, elseClause);
        }
        case TokenKind::UniqueKeyword: {
            auto keyword = consume();
            auto& list = parseRangeList();
            return &factory.uniquenessConstraint(keyword, list, expect(TokenKind::Semicolon));
        }
        case TokenKind::SoftKeyword: {
            auto soft = consume();
            auto& exprOrDist = parseExpressionOrDist();
            return &factory.expressionConstraint(soft, exprOrDist, expect(TokenKind::Semicolon));
        }
        case TokenKind::OpenBrace: {
            // Ambiguity here: an open brace could either be the start of a constraint block
            // or the start of a concatenation expression. Descend into the expression until
            // we can find out for sure one way or the other.
            if (allowBlock) {
                uint32_t index = 1;
                if (peek(1).kind == TokenKind::CloseBrace ||
                    !scanTypePart<isNotInConcatenationExpr>(index, TokenKind::OpenBrace,
                                                            TokenKind::CloseBrace)) {
                    return &parseConstraintBlock(false);
                }
            }
            break;
        }
        default:
            break;
    }

    // If we reach this point we have some invalid syntax here. If we're in a nested
    // constraint block (identified by allowBlock == true) then we should make up
    // an item and return. This is accomplished by falling through to the parseSubExpression below.
    // Otherwise, this is the top level and we should return nullptr so that we skip over
    // the offending token.
    if (!isPossibleExpression(peek().kind) && !allowBlock)
        return nullptr;

    // at this point we either have an expression with optional distribution or
    // we have an implication constraint
    Token curr = peek();
    auto expr =
        &parseSubExpression(ExpressionOptions::ConstraintContext | ExpressionOptions::AllowDist, 0);
    if (!allowBlock && curr == peek())
        return nullptr;

    if (peek(TokenKind::MinusArrow)) {
        auto arrow = consume();
        return &factory.implicationConstraint(*expr, arrow, *parseConstraintItem(true, false));
    }

    return &factory.expressionConstraint(Token(), *expr, expect(TokenKind::Semicolon));
}